

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

CordRepKind __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::RepRef::tag(RepRef *this)

{
  bool bVar1;
  CordRepKind local_24;
  anon_class_1_0_00000001 local_11;
  RepRef *local_10;
  RepRef *this_local;
  
  bVar1 = true;
  if (this->rep != (CordRep *)0x0) {
    bVar1 = this->rep->tag != '\0';
  }
  if (!bVar1) {
    local_10 = this;
    tag::anon_class_1_0_00000001::operator()(&local_11);
  }
  if (this->rep == (CordRep *)0x0) {
    local_24 = UNUSED_0;
  }
  else {
    local_24 = (CordRepKind)this->rep->tag;
  }
  return local_24;
}

Assistant:

constexpr CordRepKind tag() const {
      ABSL_ASSERT(rep == nullptr || rep->tag != CordRepKind::UNUSED_0);
      return rep ? static_cast<CordRepKind>(rep->tag) : CordRepKind::UNUSED_0;
    }